

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  ulong *puVar2;
  size_t sVar3;
  PreparedDictionary *pPVar4;
  ushort uVar5;
  uint32_t *puVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  ulong *puVar12;
  PreparedDictionary *pPVar13;
  byte bVar14;
  long lVar15;
  PreparedDictionary *pPVar16;
  uint uVar17;
  int iVar18;
  undefined1 *puVar19;
  PreparedDictionary *pPVar20;
  ulong uVar21;
  undefined1 *puVar22;
  uint uVar23;
  ulong uVar24;
  PreparedDictionary *pPVar25;
  undefined1 *puVar26;
  uint8_t uVar27;
  ulong uVar28;
  char cVar29;
  ulong uVar30;
  long lVar31;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  PreparedDictionary *local_f0;
  PreparedDictionary *local_e8;
  ulong local_d8;
  ulong local_b8 [2];
  size_t *local_a8;
  undefined1 *local_a0;
  PreparedDictionary *local_98;
  int local_8c;
  PreparedDictionary *local_88;
  ContextLut local_80;
  PreparedDictionary *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  PreparedDictionary *local_40;
  long local_38;
  
  local_98 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) - 0x10);
  local_78 = (PreparedDictionary *)((position - 7) + num_bytes);
  local_40 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    local_40 = local_78;
  }
  local_48 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_48 = 0x40;
  }
  local_a0 = (undefined1 *)(position + num_bytes);
  local_50 = *(long *)(literal_context_lut + 0x10);
  local_d8 = *(ulong *)dist_cache;
  pPVar20 = (PreparedDictionary *)(local_48 + position);
  local_80 = literal_context_lut;
  local_58 = *(long *)(literal_context_lut + 0x60);
  uVar17 = (uint)ringbuffer_mask;
  local_70 = ringbuffer_mask & 0xffffffff;
  local_60 = (ulong)(uint)((int)local_48 * 4);
  local_a8 = last_insert_len;
  puVar19 = local_a0;
  uVar28 = local_60;
  do {
LAB_00353157:
    pPVar25 = (PreparedDictionary *)position;
    if (puVar19 <= &pPVar25->source_size) {
      *(undefined1 **)dist_cache = puVar19 + (local_d8 - (long)pPVar25);
      *(long *)commands = *(long *)commands + ((long)local_a8 - (long)last_insert_len >> 4);
      return;
    }
    local_108 = (long)puVar19 - (long)pPVar25;
    pPVar13 = local_98;
    if (pPVar25 < local_98) {
      pPVar13 = pPVar25;
    }
    uVar30 = (ulong)pPVar25 & ringbuffer_mask;
    puVar2 = (ulong *)(ringbuffer + uVar30);
    uVar27 = ringbuffer[uVar30];
    local_e8 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_100 = 0x7e4;
    if (((PreparedDictionary *)((long)pPVar25 - (long)local_e8) < pPVar25) &&
       (uVar8 = (uint)(PreparedDictionary *)((long)pPVar25 - (long)local_e8) & uVar17,
       uVar27 == ringbuffer[uVar8])) {
      puVar11 = (ulong *)(ringbuffer + uVar8);
      lVar15 = 0;
      puVar12 = puVar2;
      uVar21 = local_108;
LAB_003531d3:
      if (uVar21 < 8) {
        for (uVar24 = 0;
            (uVar21 != uVar24 &&
            (*(char *)((long)puVar11 + uVar24) == *(char *)((long)puVar12 + uVar24)));
            uVar24 = uVar24 + 1) {
        }
      }
      else {
        if (*puVar12 == *puVar11) break;
        uVar24 = *puVar11 ^ *puVar12;
        uVar21 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar24 = uVar21 >> 3 & 0x1fffffff;
      }
      uVar24 = uVar24 - lVar15;
      if ((uVar24 < 4) || (uVar21 = uVar24 * 0x87 + 0x78f, uVar21 < 0x7e5)) goto LAB_00353240;
      uVar27 = *(uint8_t *)((long)puVar2 + uVar24);
      local_100 = uVar21;
    }
    else {
LAB_00353240:
      local_e8 = (PreparedDictionary *)0x0;
      uVar24 = 0;
    }
    sVar3 = (params->dictionary).compound.num_chunks;
    local_b8[0] = (ulong)(*(long *)(ringbuffer + uVar30) * 0x7bd3579bd3000000) >> 0x30;
    local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar30) * 0x7bd3579bd3000000) >>
                                  0x30) + 8 & 0xffff);
    uVar8 = (uint)pPVar25;
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      uVar10 = *(uint *)(sVar3 + local_b8[lVar15] * 4);
      puVar12 = (ulong *)(ringbuffer + (uVar17 & uVar10));
      if (((uVar27 == *(uint8_t *)(uVar24 + (long)puVar12)) &&
          (pPVar25 != (PreparedDictionary *)(ulong)uVar10)) &&
         (pPVar16 = (PreparedDictionary *)((long)pPVar25 - (long)(ulong)uVar10), pPVar16 <= pPVar13)
         ) {
        lVar31 = 0;
        uVar30 = local_108;
        puVar11 = puVar2;
LAB_003532e0:
        if (uVar30 < 8) {
          for (uVar21 = 0;
              (uVar30 != uVar21 &&
              (*(char *)((long)puVar12 + uVar21) == *(char *)((long)puVar11 + uVar21)));
              uVar21 = uVar21 + 1) {
          }
        }
        else {
          if (*puVar11 == *puVar12) goto code_r0x003532f1;
          uVar21 = *puVar12 ^ *puVar11;
          uVar30 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar21 = uVar30 >> 3 & 0x1fffffff;
        }
        uVar21 = uVar21 - lVar31;
        if (3 < uVar21) {
          iVar18 = 0x1f;
          if ((uint)pPVar16 != 0) {
            for (; (uint)pPVar16 >> iVar18 == 0; iVar18 = iVar18 + -1) {
            }
          }
          uVar30 = (ulong)(iVar18 * -0x1e + 0x780) + uVar21 * 0x87;
          if (local_100 < uVar30) {
            uVar27 = *(uint8_t *)((long)puVar2 + uVar21);
            uVar24 = uVar21;
            local_100 = uVar30;
            local_e8 = pPVar16;
          }
        }
      }
    }
    *(uint *)(sVar3 + *(long *)((long)local_b8 + (ulong)(uVar8 & 8)) * 4) = uVar8;
    if (0x1f < local_108 && ((ulong)pPVar25 & 3) == 0) {
      for (pPVar16 = (params->dictionary).compound.chunks[1]; pPVar16 <= pPVar25;
          pPVar16 = (PreparedDictionary *)&pPVar16->num_items) {
        uVar10 = (uint)(params->dictionary).compound.total_size;
        uVar9 = uVar10 & 0x3fffffff;
        *(uint *)&(params->dictionary).compound.total_size =
             uVar10 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
             (uint)ringbuffer[(ulong)&pPVar16[1].source_size & ringbuffer_mask] +
             ~(uint)ringbuffer[(ulong)pPVar16 & ringbuffer_mask] *
             *(int *)((params->dictionary).compound.chunks + 3) + 1;
        if (uVar9 < 0x1000000) {
          pPVar4 = (params->dictionary).compound.chunks[0];
          uVar10 = (&pPVar4->magic)[uVar9];
          (&pPVar4->magic)[uVar9] = (uint32_t)pPVar16;
          if ((pPVar16 == pPVar25) && (uVar10 != 0xffffffff)) {
            uVar9 = uVar8 - uVar10;
            if ((PreparedDictionary *)(ulong)uVar9 <= pPVar13) {
              puVar11 = (ulong *)(ringbuffer + (uVar10 & uVar17));
              lVar15 = 0;
              uVar30 = local_108;
              puVar12 = puVar2;
LAB_00353410:
              if (uVar30 < 8) {
                for (uVar21 = 0;
                    (uVar30 != uVar21 &&
                    (*(char *)((long)puVar11 + uVar21) == *(char *)((long)puVar12 + uVar21)));
                    uVar21 = uVar21 + 1) {
                }
              }
              else {
                if (*puVar12 == *puVar11) goto code_r0x00353421;
                uVar21 = *puVar11 ^ *puVar12;
                uVar30 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar21 = uVar30 >> 3 & 0x1fffffff;
              }
              uVar21 = uVar21 - lVar15;
              if ((3 < uVar21) && (uVar24 < uVar21)) {
                iVar18 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                  }
                }
                uVar30 = (ulong)(iVar18 * -0x1e + 0x780) + uVar21 * 0x87;
                if (local_100 < uVar30) {
                  uVar24 = uVar21;
                  local_100 = uVar30;
                  local_e8 = (PreparedDictionary *)(ulong)uVar9;
                }
              }
            }
          }
        }
      }
      (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar25->num_items;
    }
    puVar19 = local_a0;
    if (local_100 < 0x7e5) {
      local_d8 = local_d8 + 1;
      position = (long)&pPVar25->magic + 1;
      if (pPVar20 < position) {
        if ((PreparedDictionary *)((long)&pPVar20->magic + uVar28) < position) {
          pPVar25 = (PreparedDictionary *)((long)&pPVar25->bucket_bits + 1);
          if (local_78 <= pPVar25) {
            pPVar25 = local_78;
          }
          for (; puVar19 = local_a0, position < pPVar25;
              position = (size_t)&((PreparedDictionary *)position)->num_items) {
            *(uint *)(sVar3 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * 0x7bd3579bd3000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_d8 = local_d8 + 4;
          }
        }
        else {
          pPVar25 = (PreparedDictionary *)((long)&pPVar25->source_size + 1);
          if (local_78 <= pPVar25) {
            pPVar25 = local_78;
          }
          for (; puVar19 = local_a0, position < pPVar25;
              position = (long)&((PreparedDictionary *)position)->magic + 2) {
            *(uint *)(sVar3 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * 0x7bd3579bd3000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            local_d8 = local_d8 + 2;
          }
        }
      }
      goto LAB_00353157;
    }
    local_88 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_68 = local_d8 + 4;
    local_8c = 0;
    do {
      local_108 = local_108 - 1;
      uVar28 = uVar24 - 1;
      if (local_108 <= uVar24 - 1) {
        uVar28 = local_108;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar28 = 0;
      }
      pPVar20 = (PreparedDictionary *)((long)&pPVar25->magic + 1);
      pPVar13 = local_98;
      if (pPVar20 < local_98) {
        pPVar13 = pPVar20;
      }
      puVar2 = (ulong *)(ringbuffer + ((ulong)pPVar20 & ringbuffer_mask));
      cVar29 = *(char *)(uVar28 + (long)puVar2);
      local_f8 = 0x7e4;
      if (((PreparedDictionary *)((long)pPVar20 - (long)local_88) < pPVar20) &&
         (puVar12 = (ulong *)(ringbuffer +
                             ((uint)(PreparedDictionary *)((long)pPVar20 - (long)local_88) & uVar17)
                             ), cVar29 == *(char *)(uVar28 + (long)puVar12))) {
        lVar15 = 0;
        uVar30 = local_108;
        puVar11 = puVar2;
LAB_0035361e:
        if (uVar30 < 8) {
          for (uVar21 = 0;
              (uVar30 != uVar21 &&
              (*(char *)((long)puVar12 + uVar21) == *(char *)((long)puVar11 + uVar21)));
              uVar21 = uVar21 + 1) {
          }
          uVar21 = uVar21 - lVar15;
        }
        else {
          if (*puVar11 == *puVar12) goto code_r0x00353632;
          uVar21 = *puVar12 ^ *puVar11;
          uVar30 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar21 = (uVar30 >> 3 & 0x1fffffff) - lVar15;
        }
        if ((uVar21 < 4) || (uVar30 = uVar21 * 0x87 + 0x78f, uVar30 < 0x7e5)) goto LAB_003536b5;
        cVar29 = *(char *)((long)puVar2 + uVar21);
        uVar28 = uVar21;
        local_f8 = uVar30;
        local_f0 = local_88;
      }
      else {
LAB_003536b5:
        local_f0 = (PreparedDictionary *)0x0;
      }
      local_b8[0] = (ulong)(*(long *)(ringbuffer + ((ulong)pPVar20 & ringbuffer_mask)) *
                           0x7bd3579bd3000000) >> 0x30;
      local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer +
                                                      ((ulong)pPVar20 & ringbuffer_mask)) *
                                            0x7bd3579bd3000000) >> 0x30) + 8 & 0xffff);
      uVar8 = (uint)pPVar20;
      local_38 = *(long *)((long)local_b8 + (ulong)(uVar8 & 8));
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        uVar10 = *(uint *)(sVar3 + local_b8[lVar15] * 4);
        puVar12 = (ulong *)(ringbuffer + (uVar17 & uVar10));
        if (((cVar29 == *(char *)(uVar28 + (long)puVar12)) &&
            (pPVar20 != (PreparedDictionary *)(ulong)uVar10)) &&
           (pPVar16 = (PreparedDictionary *)((long)pPVar20 - (long)(ulong)uVar10),
           pPVar16 <= pPVar13)) {
          lVar31 = 0;
          uVar30 = local_108;
          puVar11 = puVar2;
LAB_00353751:
          if (uVar30 < 8) {
            for (uVar21 = 0;
                (uVar30 != uVar21 &&
                (*(char *)((long)puVar12 + uVar21) == *(char *)((long)puVar11 + uVar21)));
                uVar21 = uVar21 + 1) {
            }
          }
          else {
            if (*puVar11 == *puVar12) goto code_r0x00353763;
            uVar21 = *puVar12 ^ *puVar11;
            uVar30 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar21 = uVar30 >> 3 & 0x1fffffff;
          }
          uVar21 = uVar21 - lVar31;
          if (3 < uVar21) {
            iVar18 = 0x1f;
            if ((uint)pPVar16 != 0) {
              for (; (uint)pPVar16 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar30 = (ulong)(iVar18 * -0x1e + 0x780) + uVar21 * 0x87;
            if (local_f8 < uVar30) {
              cVar29 = *(char *)((long)puVar2 + uVar21);
              uVar28 = uVar21;
              local_f8 = uVar30;
              local_f0 = pPVar16;
            }
          }
        }
      }
      *(uint *)(sVar3 + local_38 * 4) = uVar8;
      if (0x1f < local_108 && ((ulong)pPVar20 & 3) == 0) {
        for (pPVar16 = (params->dictionary).compound.chunks[1]; pPVar16 <= pPVar20;
            pPVar16 = (PreparedDictionary *)&pPVar16->num_items) {
          uVar10 = (uint)(params->dictionary).compound.total_size;
          uVar9 = uVar10 & 0x3fffffff;
          *(uint *)&(params->dictionary).compound.total_size =
               uVar10 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
               (uint)ringbuffer[(ulong)&pPVar16[1].source_size & ringbuffer_mask] +
               ~(uint)ringbuffer[(ulong)pPVar16 & ringbuffer_mask] *
               *(int *)((params->dictionary).compound.chunks + 3) + 1;
          if (uVar9 < 0x1000000) {
            pPVar4 = (params->dictionary).compound.chunks[0];
            uVar10 = (&pPVar4->magic)[uVar9];
            (&pPVar4->magic)[uVar9] = (uint32_t)pPVar16;
            if ((pPVar16 == pPVar20) && (uVar10 != 0xffffffff)) {
              uVar9 = uVar8 - uVar10;
              if ((PreparedDictionary *)(ulong)uVar9 <= pPVar13) {
                puVar11 = (ulong *)(ringbuffer + (uVar10 & uVar17));
                lVar15 = 0;
                uVar30 = local_108;
                puVar12 = puVar2;
LAB_0035389d:
                if (uVar30 < 8) {
                  for (uVar21 = 0;
                      (uVar30 != uVar21 &&
                      (*(char *)((long)puVar11 + uVar21) == *(char *)((long)puVar12 + uVar21)));
                      uVar21 = uVar21 + 1) {
                  }
                }
                else {
                  if (*puVar12 == *puVar11) goto code_r0x003538ae;
                  uVar21 = *puVar11 ^ *puVar12;
                  uVar30 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar21 = uVar30 >> 3 & 0x1fffffff;
                }
                uVar21 = uVar21 - lVar15;
                if ((3 < uVar21) && (uVar28 < uVar21)) {
                  iVar18 = 0x1f;
                  if (uVar9 != 0) {
                    for (; uVar9 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                    }
                  }
                  uVar30 = (ulong)(iVar18 * -0x1e + 0x780) + uVar21 * 0x87;
                  if (local_f8 < uVar30) {
                    uVar28 = uVar21;
                    local_f8 = uVar30;
                    local_f0 = (PreparedDictionary *)(ulong)uVar9;
                  }
                }
              }
            }
          }
        }
        (params->dictionary).compound.chunks[1] =
             (PreparedDictionary *)((long)&pPVar25->num_items + 1);
      }
      pPVar13 = pPVar25;
      uVar30 = local_d8;
      if ((local_f8 < local_100 + 0xaf) ||
         (local_e8 = local_f0, pPVar13 = pPVar20, uVar24 = uVar28, uVar30 = local_68, local_8c == 3)
         ) break;
      local_d8 = local_d8 + 1;
      local_8c = local_8c + 1;
      puVar6 = &pPVar25->source_size;
      local_100 = local_f8;
      pPVar25 = pPVar20;
      uVar30 = local_d8;
    } while ((undefined1 *)((long)puVar6 + 1U) < local_a0);
    local_d8 = uVar30;
    pPVar20 = (PreparedDictionary *)((long)&pPVar13->magic + local_50);
    if (local_98 <= pPVar20) {
      pPVar20 = local_98;
    }
    pPVar20 = (PreparedDictionary *)((long)&pPVar20->magic + local_58);
    if (pPVar20 < local_e8) {
LAB_003539bf:
      puVar22 = (undefined1 *)((long)&local_e8->hash_bits + 3);
LAB_003539c3:
      if ((local_e8 <= pPVar20) && (puVar22 != (undefined1 *)0x0)) {
        *(undefined4 *)((long)(hasher->common).extra + 0xc) =
             *(undefined4 *)((hasher->common).extra + 1);
        *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
        *(int *)(hasher->common).extra = (int)local_e8;
      }
    }
    else {
      pPVar25 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      if (local_e8 != pPVar25) {
        pPVar16 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
        puVar22 = (undefined1 *)0x1;
        if (local_e8 != pPVar16) {
          uVar28 = (long)local_e8 + (3 - (long)pPVar25);
          if (uVar28 < 7) {
            bVar14 = (byte)((int)uVar28 << 2);
            uVar8 = 0x9750468;
          }
          else {
            uVar28 = (long)local_e8 + (3 - (long)pPVar16);
            if (6 < uVar28) {
              puVar22 = (undefined1 *)0x2;
              if ((local_e8 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
                 (puVar22 = (undefined1 *)0x3,
                 local_e8 !=
                 (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc)))
              goto LAB_003539bf;
              goto LAB_003539c3;
            }
            bVar14 = (byte)((int)uVar28 << 2);
            uVar8 = 0xfdb1ace;
          }
          puVar22 = (undefined1 *)(ulong)(uVar8 >> (bVar14 & 0x1f) & 0xf);
        }
        goto LAB_003539c3;
      }
      puVar22 = (undefined1 *)0x0;
    }
    uVar8 = (uint)local_d8;
    *(uint *)local_a8 = uVar8;
    uVar10 = (uint)uVar24;
    *(uint *)((long)local_a8 + 4) = uVar10;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar9 = 0;
    if (puVar1 <= puVar22) {
      bVar14 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar26 = puVar22 + ((4L << (bVar14 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar9 = 0x1f;
      uVar23 = (uint)puVar26;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
      uVar28 = (ulong)(((ulong)puVar26 >> ((ulong)uVar9 & 0x3f) & 1) != 0);
      lVar15 = (ulong)uVar9 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar22 = (undefined1 *)
                ((ulong)(puVar1 + (uVar28 + lVar15 * 2 + 0xfffe << (bVar14 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar14 & 0x1f)) & uVar23)) | lVar15 * 0x400);
      uVar9 = (uint)((long)puVar26 - (uVar28 + 2 << ((byte)uVar9 & 0x3f)) >> (bVar14 & 0x3f));
    }
    *(short *)((long)local_a8 + 0xe) = (short)puVar22;
    *(uint *)(local_a8 + 1) = uVar9;
    if (5 < local_d8) {
      if (local_d8 < 0x82) {
        uVar8 = 0x1f;
        uVar9 = (uint)(local_d8 - 2);
        if (uVar9 != 0) {
          for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (int)(local_d8 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar8 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_d8 < 0x842) {
        uVar9 = 0x1f;
        if (uVar8 - 0x42 != 0) {
          for (; uVar8 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar8 = (uVar9 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar8 = 0x15;
        if (0x1841 < local_d8) {
          uVar8 = (uint)(ushort)(0x17 - (local_d8 < 0x5842));
        }
      }
    }
    uVar28 = (ulong)(int)uVar10;
    if (uVar28 < 10) {
      uVar9 = uVar10 - 2;
    }
    else if (uVar28 < 0x86) {
      uVar10 = 0x1f;
      uVar9 = (uint)(uVar28 - 6);
      if (uVar9 != 0) {
        for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar9 = (int)(uVar28 - 6 >> ((char)(uVar10 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar10 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar9 = 0x17;
      if (uVar28 < 0x846) {
        uVar9 = 0x1f;
        if (uVar10 - 0x46 != 0) {
          for (; uVar10 - 0x46 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uVar9 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar9;
    sVar7 = (uVar5 & 7) + ((ushort)uVar8 & 7) * 8;
    if (((((ulong)puVar22 & 0x3ff) == 0) && ((ushort)uVar8 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        sVar7 = sVar7 + 0x40;
      }
    }
    else {
      iVar18 = ((uVar8 & 0xffff) >> 3) * 3 + ((uVar9 & 0xffff) >> 3);
      sVar7 = sVar7 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
    }
    *(short *)((long)local_a8 + 0xc) = sVar7;
    *num_commands = *num_commands + local_d8;
    position = (long)&pPVar13->magic + uVar24;
    pPVar25 = local_40;
    if (position < local_40) {
      pPVar25 = (PreparedDictionary *)position;
    }
    pPVar16 = (PreparedDictionary *)((long)&pPVar13->magic + 2);
    if (local_e8 < (PreparedDictionary *)(uVar24 >> 2)) {
      pPVar20 = (PreparedDictionary *)(position + (long)local_e8 * -4);
      if (pPVar20 < pPVar16) {
        pPVar20 = pPVar16;
      }
      pPVar16 = pPVar20;
      if (pPVar25 < pPVar20) {
        pPVar16 = pPVar25;
      }
    }
    pPVar20 = (PreparedDictionary *)((long)&pPVar13->magic + uVar24 * 2 + local_48);
    for (; pPVar16 < pPVar25; pPVar16 = (PreparedDictionary *)((long)&pPVar16->magic + 1)) {
      *(uint *)(sVar3 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                ((ulong)pPVar16 & ringbuffer_mask))
                                                      * 0x7bd3579bd3000000) >> 0x30) +
                                ((uint)pPVar16 & 8) & 0xffff) * 4) = (uint)pPVar16;
    }
    local_a8 = local_a8 + 2;
    local_d8 = 0;
    uVar28 = local_60;
  } while( true );
  puVar12 = puVar12 + 1;
  puVar11 = puVar11 + 1;
  uVar21 = uVar21 - 8;
  lVar15 = lVar15 + -8;
  goto LAB_003531d3;
code_r0x003532f1:
  puVar11 = puVar11 + 1;
  puVar12 = puVar12 + 1;
  uVar30 = uVar30 - 8;
  lVar31 = lVar31 + -8;
  goto LAB_003532e0;
code_r0x00353421:
  puVar12 = puVar12 + 1;
  puVar11 = puVar11 + 1;
  uVar30 = uVar30 - 8;
  lVar15 = lVar15 + -8;
  goto LAB_00353410;
code_r0x00353632:
  puVar11 = puVar11 + 1;
  puVar12 = puVar12 + 1;
  uVar30 = uVar30 - 8;
  lVar15 = lVar15 + -8;
  goto LAB_0035361e;
code_r0x00353763:
  puVar11 = puVar11 + 1;
  puVar12 = puVar12 + 1;
  uVar30 = uVar30 - 8;
  lVar31 = lVar31 + -8;
  goto LAB_00353751;
code_r0x003538ae:
  puVar12 = puVar12 + 1;
  puVar11 = puVar11 + 1;
  uVar30 = uVar30 - 8;
  lVar15 = lVar15 + -8;
  goto LAB_0035389d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}